

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

ListReader * __thiscall
capnp::_::OrphanBuilder::asListReader
          (ListReader *__return_storage_ptr__,OrphanBuilder *this,ElementSize elementSize)

{
  SegmentBuilder **ppSVar1;
  ushort uVar2;
  ushort uVar3;
  CapTableReader *pCVar4;
  word *pwVar5;
  Arena *pAVar6;
  ReadLimiter *pRVar7;
  ulong uVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar11;
  SegmentBuilder **ppSVar12;
  CapTableBuilder **ppCVar13;
  uint uVar14;
  SegmentBuilder *pSVar15;
  ulong uVar16;
  ElementSize EVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  char *macroArgs;
  uint uVar21;
  Fault f;
  char *params;
  Fault local_30;
  SegmentBuilder *pSVar10;
  
  uVar14 = (uint)(this->tag).content;
  if (*(int *)((long)&(this->tag).content + 4) != 0 || uVar14 != 0) {
    pSVar10 = this->segment;
    pCVar4 = &this->capTable->super_CapTableReader;
    ppSVar12 = (SegmentBuilder **)this->location;
    if (pSVar10 == (SegmentBuilder *)0x0) {
      pSVar10 = (SegmentBuilder *)0x0;
LAB_001fc543:
      if (ppSVar12 == (SegmentBuilder **)0x0) goto LAB_001fc742;
LAB_001fc54f:
      uVar14 = (uint)(this->tag).content;
    }
    else {
      if ((uVar14 & 3) != 2) goto LAB_001fc543;
      iVar9 = (*((pSVar10->super_SegmentReader).arena)->_vptr_Arena[2])();
      pSVar10 = (SegmentBuilder *)CONCAT44(extraout_var,iVar9);
      if (pSVar10 == (SegmentBuilder *)0x0) {
        asListReader();
        goto LAB_001fc742;
      }
      uVar16 = (pSVar10->super_SegmentReader).ptr.size_;
      uVar14 = (uint)(this->tag).content;
      uVar11 = (ulong)(uVar14 >> 3);
      if ((long)uVar16 < (long)(ulong)(uVar14 >> 3)) {
        uVar11 = uVar16;
      }
      uVar20 = 2 - (ulong)((uVar14 & 4) == 0);
      if (uVar16 < uVar11 + uVar20) {
LAB_001fc828:
        asListReader();
        goto LAB_001fc742;
      }
      pwVar5 = (pSVar10->super_SegmentReader).ptr.ptr;
      pAVar6 = (pSVar10->super_SegmentReader).arena;
      pRVar7 = (pSVar10->super_SegmentReader).readLimiter;
      uVar8 = pRVar7->limit;
      if (uVar8 < uVar20) {
        (*pAVar6->_vptr_Arena[3])();
        goto LAB_001fc828;
      }
      this = (OrphanBuilder *)(pwVar5 + uVar11);
      ppSVar1 = &this->segment;
      pRVar7->limit = uVar8 - uVar20;
      if ((uVar14 & 4) != 0) {
        iVar9 = (*pAVar6->_vptr_Arena[2])(pAVar6,(ulong)*(uint *)((long)&(this->tag).content + 4));
        pSVar10 = (SegmentBuilder *)CONCAT44(extraout_var_00,iVar9);
        if (pSVar10 == (SegmentBuilder *)0x0) {
          asListReader();
        }
        else {
          uVar14 = (uint)(this->tag).content;
          if ((uVar14 & 3) == 2) {
            uVar11 = (ulong)(uVar14 >> 3);
            uVar16 = (pSVar10->super_SegmentReader).ptr.size_;
            if ((long)uVar16 < (long)uVar11) {
              uVar11 = uVar16;
            }
            ppSVar12 = (SegmentBuilder **)((pSVar10->super_SegmentReader).ptr.ptr + uVar11);
            this = (OrphanBuilder *)ppSVar1;
            goto LAB_001fc543;
          }
          asListReader();
        }
        goto LAB_001fc742;
      }
      uVar14 = (uint)(this->tag).content;
      lVar19 = (long)((int)uVar14 >> 2);
      ppSVar12 = (SegmentBuilder **)(pwVar5 + uVar16);
      if ((lVar19 < (long)pwVar5 - (long)ppSVar1 >> 3) ||
         ((long)ppSVar12 - (long)ppSVar1 >> 3 < lVar19)) goto LAB_001fc54f;
      ppSVar12 = ppSVar1 + lVar19;
    }
    if ((uVar14 & 3) == 1) {
      uVar14 = *(uint *)((long)&(this->tag).content + 4);
      EVar17 = (ElementSize)uVar14 & INLINE_COMPOSITE;
      if (EVar17 == INLINE_COMPOSITE) {
        uVar14 = uVar14 >> 3;
        if (pSVar10 == (SegmentBuilder *)0x0) {
LAB_001fc5b1:
          if ((*(uint *)ppSVar12 & 3) == 0) {
            uVar18 = *(uint *)ppSVar12 >> 2 & 0x1fffffff;
            uVar16 = (ulong)uVar18;
            uVar2 = *(ushort *)((long)ppSVar12 + 4);
            uVar3 = *(ushort *)((long)ppSVar12 + 6);
            uVar21 = (uint)uVar3 + (uint)uVar2;
            if (uVar21 * uVar16 < (ulong)uVar14 || uVar21 * uVar16 - (ulong)uVar14 == 0) {
              pSVar15 = (SegmentBuilder *)0x0;
              if (uVar21 != 0) {
                pSVar15 = pSVar10;
              }
              if ((pSVar10 != (SegmentBuilder *)0x0) && (uVar21 == 0)) {
                pRVar7 = (pSVar10->super_SegmentReader).readLimiter;
                uVar11 = pRVar7->limit;
                if (uVar11 < uVar16) {
                  asListReader();
                  goto LAB_001fc742;
                }
                pRVar7->limit = uVar11 - uVar16;
                pSVar15 = pSVar10;
              }
              ppCVar13 = (CapTableBuilder **)(ppSVar12 + 1);
              if (elementSize - 2 < 4) {
                if (uVar2 == 0) {
                  asListReader();
                  goto LAB_001fc742;
                }
              }
              else if (elementSize == POINTER) {
                if (uVar3 == 0) {
                  asListReader();
                  goto LAB_001fc742;
                }
                ppCVar13 = ppCVar13 + uVar2;
              }
              else if (elementSize == BIT) {
                params = 
                "Found struct list where bit list was expected; upgrading boolean lists to structs is no longer supported."
                ;
                macroArgs = 
                "\"Found struct list where bit list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                ;
                iVar9 = 0x905;
                goto LAB_001fc730;
              }
              __return_storage_ptr__->segment = &pSVar15->super_SegmentReader;
              __return_storage_ptr__->capTable = pCVar4;
              __return_storage_ptr__->ptr = (byte *)ppCVar13;
              __return_storage_ptr__->elementCount = uVar18;
              __return_storage_ptr__->step = uVar21 * 0x40;
              __return_storage_ptr__->structDataSize = (uint)uVar2 << 6;
              __return_storage_ptr__->structPointerCount = uVar3;
              __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
LAB_001fc7e2:
              iVar9 = 0x7ffffffe;
              goto LAB_001fc7e7;
            }
            asListReader();
          }
          else {
            asListReader();
          }
        }
        else {
          if (((long)ppSVar12 - (long)(pSVar10->super_SegmentReader).ptr.ptr >> 3) + (ulong)uVar14 +
              1 <= (pSVar10->super_SegmentReader).ptr.size_) {
            uVar16 = (ulong)uVar14 + 1;
            pRVar7 = (pSVar10->super_SegmentReader).readLimiter;
            uVar11 = pRVar7->limit;
            if (uVar16 <= uVar11) {
              pRVar7->limit = uVar11 - uVar16;
              goto LAB_001fc5b1;
            }
            (*((pSVar10->super_SegmentReader).arena)->_vptr_Arena[3])();
          }
          asListReader();
        }
      }
      else {
        uVar18 = *(uint *)(BITS_PER_ELEMENT_TABLE + ((ulong)uVar14 & 7) * 4);
        uVar16 = (ulong)(uVar14 >> 3);
        uVar21 = (uint)(EVar17 == POINTER) * 0x40 + uVar18;
        if (pSVar10 == (SegmentBuilder *)0x0) {
          if ((uVar14 & 7) != 0) {
LAB_001fc6fe:
            if ((elementSize != BIT) && (EVar17 == BIT)) {
              params = 
              "Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
              ;
              macroArgs = 
              "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
              ;
              iVar9 = 0x945;
LAB_001fc730:
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                        (&local_30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                         ,iVar9,FAILED,(char *)0x0,macroArgs,(char (*) [106])params);
              kj::_::Debug::Fault::~Fault(&local_30);
              goto LAB_001fc742;
            }
          }
LAB_001fc762:
          if (uVar18 < *(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)elementSize * 4)) {
            asListReader();
          }
          else {
            if ((elementSize != POINTER) || (EVar17 == POINTER)) {
              __return_storage_ptr__->segment = &pSVar10->super_SegmentReader;
              __return_storage_ptr__->capTable = pCVar4;
              __return_storage_ptr__->ptr = (byte *)ppSVar12;
              __return_storage_ptr__->elementCount = uVar14 >> 3;
              __return_storage_ptr__->step = uVar21;
              __return_storage_ptr__->structDataSize = uVar18;
              __return_storage_ptr__->structPointerCount = (ushort)(EVar17 == POINTER);
              __return_storage_ptr__->elementSize = EVar17;
              goto LAB_001fc7e2;
            }
            asListReader();
          }
        }
        else {
          uVar11 = uVar21 * uVar16 + 0x3f >> 6 & 0xffffffff;
          if (((long)ppSVar12 - (long)(pSVar10->super_SegmentReader).ptr.ptr >> 3) + uVar11 <=
              (pSVar10->super_SegmentReader).ptr.size_) {
            pRVar7 = (pSVar10->super_SegmentReader).readLimiter;
            if (uVar11 <= pRVar7->limit) {
              pRVar7->limit = pRVar7->limit - uVar11;
              if ((uVar14 & 7) != 0) goto LAB_001fc6fe;
              if (pRVar7->limit < uVar16) {
                asListReader();
                goto LAB_001fc742;
              }
              pRVar7->limit = pRVar7->limit - uVar16;
              goto LAB_001fc762;
            }
            (*((pSVar10->super_SegmentReader).arena)->_vptr_Arena[3])();
          }
          asListReader();
        }
      }
    }
    else {
      asListReader();
    }
  }
LAB_001fc742:
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentReader *)0x0;
  __return_storage_ptr__->capTable = (CapTableReader *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
  __return_storage_ptr__->elementSize = elementSize;
  iVar9 = 0x7fffffff;
LAB_001fc7e7:
  __return_storage_ptr__->nestingLimit = iVar9;
  return __return_storage_ptr__;
}

Assistant:

ListReader OrphanBuilder::asListReader(ElementSize elementSize) const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readListPointer(
      segment, capTable, tagAsPtr(), location, nullptr, elementSize, kj::maxValue);
}